

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_http_client_async_blocking_timeout.cpp
# Opt level: O3

bool __thiscall Client::ReadResponse(Client *this)

{
  BIO *pBVar1;
  error_code ec_00;
  bool bVar2;
  ostream *poVar3;
  error_code ec;
  error_code local_a8;
  error_code local_98;
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  undefined1 local_60 [24];
  Client *local_48;
  error_code *local_40;
  void *local_38;
  error_category *peStack_30;
  
  local_88._0_8_ =
       (basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)0x12a05f200;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::expires_after(&this->deadline_,(duration *)local_88);
  boost::system::error_code::error_code<boost::asio::error::basic_errors>
            (&local_a8,try_again,(type *)0x0);
  local_88._16_8_ =
       (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88._24_8_ =
       (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish + -local_88._16_8_;
  if ((error_category *)local_88._24_8_ == (error_category *)0x0) {
    local_88._16_8_ = (pointer)0x0;
  }
  local_88._0_8_ = &this->ssl_socket_;
  local_88._8_8_ = &(this->ssl_socket_).core_;
  local_68._M_p = (pointer)0x0;
  boost::system::error_code::error_code((error_code *)local_60);
  local_60._16_8_ = 0;
  local_48 = this;
  local_40 = &local_a8;
  boost::system::error_code::error_code(&local_98);
  ec_00.failed_ = local_98.failed_;
  ec_00._5_3_ = local_98._5_3_;
  ec_00.val_ = local_98.val_;
  ec_00.cat_ = local_98.cat_;
  boost::asio::ssl::detail::
  io_op<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/sprinfall[P]boost-asio-study/src/ssl_http_client_async_blocking_timeout.cpp:260:7)>
  ::operator()((io_op<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_boost::asio::ssl::detail::read_op<boost::asio::mutable_buffer>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_sprinfall[P]boost_asio_study_src_ssl_http_client_async_blocking_timeout_cpp:260:7)>
                *)local_88,ec_00,0,1);
  do {
    boost::system::error_code::error_code(&local_98);
    boost::asio::detail::scheduler::run_one((this->io_context_).impl_,&local_98);
    if (local_98.failed_ == true) {
      local_38 = (void *)CONCAT44(local_98._4_4_,local_98.val_);
      peStack_30 = local_98.cat_;
      std::runtime_error::runtime_error((runtime_error *)local_88,"");
      local_88._0_8_ = &PTR__system_error_001607d0;
      local_88._16_8_ = local_38;
      local_88._24_8_ = peStack_30;
      local_68._M_p = local_60 + 8;
      local_60._0_8_ = 0;
      local_60[8] = '\0';
      boost::throw_exception<boost::system::system_error>((system_error *)local_88);
    }
    boost::system::error_code::error_code<boost::asio::error::basic_errors>
              ((error_code *)local_88,try_again,(type *)0x0);
    if (local_a8.val_ != local_88._0_4_) break;
    pBVar1 = ((engine *)local_88._8_8_)->ext_bio_;
    bVar2 = ((engine *)&(local_a8.cat_)->_vptr_error_category)->ext_bio_ == pBVar1;
    if (pBVar1 == (BIO *)0x0) {
      bVar2 = local_a8.cat_ == (error_category *)local_88._8_8_;
    }
  } while (bVar2);
  if (local_a8.failed_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Read failed: ",0xd);
    (**(_func_int **)(((engine *)&(local_a8.cat_)->_vptr_error_category)->ssl_ + 0x20))
              (local_88,local_a8.cat_,(ulong)(uint)local_a8.val_);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_88._0_8_,local_88._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
      operator_delete((void *)local_88._0_8_);
    }
  }
  return (bool)(local_a8.failed_ ^ 1);
}

Assistant:

bool Client::ReadResponse() {
  deadline_.expires_after(std::chrono::seconds(kMaxReceiveSeconds));

  boost::system::error_code ec = boost::asio::error::would_block;

  ssl_socket_.async_read_some(
      boost::asio::buffer(buffer_),
      [this, &ec](boost::system::error_code inner_ec, std::size_t length) {
        ec = inner_ec;

        if (inner_ec || length == 0) {
          std::cout << "Socket read error." << std::endl;
          return;
        }

        std::cout.write(buffer_.data(), length);

        // TODO: Call ReadResponse() to read until the end.
        ReadResponse();
      });

  // Block until the asynchronous operation has completed.
  do {
    io_context_.run_one();
  } while (ec == boost::asio::error::would_block);

  if (ec) {
    std::cout << "Read failed: " << ec.message() << std::endl;
    return false;
  }

  return true;
}